

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderProgramResourceTest::initTest(GeometryShaderProgramResourceTest *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 err;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *this_01;
  bool local_ea;
  bool local_e9;
  char *local_d8;
  char *geometry_shader_code_parts [8];
  char *vertex_shader_code_parts [8];
  int local_50;
  GLuint nCodeParts;
  GLint maxGSStorageBlocks;
  GLint maxVSStorageBlocks;
  GLint maxGSAtomicCounters;
  GLint maxVSAtomicCounters;
  Functions *gl;
  GeometryShaderProgramResourceTest *local_28;
  GeometryShaderProgramResourceTest *this_local;
  
  local_28 = this;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderProgramResource.cpp"
               ,0xcd);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _maxGSAtomicCounters = CONCAT44(extraout_var,iVar2);
  maxVSStorageBlocks = 0;
  (**(code **)(_maxGSAtomicCounters + 0x868))(0x92cc,&maxVSStorageBlocks);
  maxGSStorageBlocks = 0;
  (**(code **)(_maxGSAtomicCounters + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,
             &maxGSStorageBlocks);
  local_e9 = 1 < maxVSStorageBlocks && 0 < maxGSStorageBlocks;
  this->m_atomic_counters_supported = local_e9;
  nCodeParts = 0;
  (**(code **)(_maxGSAtomicCounters + 0x868))(0x90d6,&nCodeParts);
  local_50 = 0;
  (**(code **)(_maxGSAtomicCounters + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,&local_50);
  local_ea = 1 < (int)nCodeParts && 0 < local_50;
  this->m_ssbos_supported = local_ea;
  if (((this->m_atomic_counters_supported & 1U) == 0) || ((this->m_ssbos_supported & 1U) == 0)) {
    if ((this->m_atomic_counters_supported & 1U) == 0) {
      if ((this->m_ssbos_supported & 1U) == 0) {
        geometry_shader_code_parts[1] =
             "// input from vs + gl_Position\nin vec4 vs_out_color[1];\n\nout vec4 gs_out_color;\n\nvoid main()\n{\n    // access uniform\n    gl_Position = vec4(0, 0, 0, 0);\n    gs_out_color = uni_colors_white;\n    EmitVertex();\n\n    // access uniform block\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, 0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.red;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.green;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.blue;\n    EmitVertex();\n"
        ;
        geometry_shader_code_parts[2] = "}\n";
        vertex_shader_code_parts[7]._4_4_ = 4;
      }
      else {
        geometry_shader_code_parts[1] =
             "// ssbos\nbuffer Positions\n{\n    vec4 position[4]; // referenced in GS\n} storage_positions;  // referenced in GS\n\nbuffer Ids\n{\n    int ids[4]; // not referenced in GS\n} storage_ids;  // not referenced in GS\n\n"
        ;
        geometry_shader_code_parts[2] =
             "// input from vs + gl_Position\nin vec4 vs_out_color[1];\n\nout vec4 gs_out_color;\n\nvoid main()\n{\n    // access uniform\n    gl_Position = vec4(0, 0, 0, 0);\n    gs_out_color = uni_colors_white;\n    EmitVertex();\n\n    // access uniform block\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, 0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.red;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.green;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.blue;\n    EmitVertex();\n"
        ;
        geometry_shader_code_parts[3] =
             "    // access shader storage buffers\n    gl_Position = storage_positions.position[0] + vec4(0.1, 0.1, 0, 0);\n    gs_out_color     = vec4(1.0);\n    EmitVertex();\n"
        ;
        geometry_shader_code_parts[4] = "}\n";
        vertex_shader_code_parts[7]._4_4_ = 6;
      }
    }
    else {
      geometry_shader_code_parts[1] =
           "// atomic counter buffers\nlayout (binding = 0) uniform atomic_uint uni_atom_horizontal; // not referenced in GS\nlayout (binding = 1) uniform atomic_uint uni_atom_vertical;   // referenced in GS\n\n"
      ;
      geometry_shader_code_parts[2] =
           "// input from vs + gl_Position\nin vec4 vs_out_color[1];\n\nout vec4 gs_out_color;\n\nvoid main()\n{\n    // access uniform\n    gl_Position = vec4(0, 0, 0, 0);\n    gs_out_color = uni_colors_white;\n    EmitVertex();\n\n    // access uniform block\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, 0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.red;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.green;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.blue;\n    EmitVertex();\n"
      ;
      geometry_shader_code_parts[3] =
           "    // access atomic counter\n    gl_Position = vec4(0, 0, 0, 0);\n    uint  counter = atomicCounter(uni_atom_vertical);\n    gs_out_color     = vec4(counter / 255u);\n    EmitVertex();\n"
      ;
      geometry_shader_code_parts[4] = "}\n";
      vertex_shader_code_parts[7]._4_4_ = 6;
    }
  }
  else {
    geometry_shader_code_parts[1] =
         "// atomic counter buffers\nlayout (binding = 0) uniform atomic_uint uni_atom_horizontal; // not referenced in GS\nlayout (binding = 1) uniform atomic_uint uni_atom_vertical;   // referenced in GS\n\n"
    ;
    geometry_shader_code_parts[2] =
         "// ssbos\nbuffer Positions\n{\n    vec4 position[4]; // referenced in GS\n} storage_positions;  // referenced in GS\n\nbuffer Ids\n{\n    int ids[4]; // not referenced in GS\n} storage_ids;  // not referenced in GS\n\n"
    ;
    geometry_shader_code_parts[3] =
         "// input from vs + gl_Position\nin vec4 vs_out_color[1];\n\nout vec4 gs_out_color;\n\nvoid main()\n{\n    // access uniform\n    gl_Position = vec4(0, 0, 0, 0);\n    gs_out_color = uni_colors_white;\n    EmitVertex();\n\n    // access uniform block\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, 0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.red;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.green;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.blue;\n    EmitVertex();\n"
    ;
    geometry_shader_code_parts[4] =
         "    // access atomic counter\n    gl_Position = vec4(0, 0, 0, 0);\n    uint  counter = atomicCounter(uni_atom_vertical);\n    gs_out_color     = vec4(counter / 255u);\n    EmitVertex();\n"
    ;
    geometry_shader_code_parts[5] =
         "    // access shader storage buffers\n    gl_Position = storage_positions.position[0] + vec4(0.1, 0.1, 0, 0);\n    gs_out_color     = vec4(1.0);\n    EmitVertex();\n"
    ;
    geometry_shader_code_parts[6] = "}\n";
    vertex_shader_code_parts[7]._4_4_ = 8;
  }
  geometry_shader_code_parts[7] =
       "${VERSION}\n\nprecision highp float;\n\n// uniforms included here\n";
  geometry_shader_code_parts[0] =
       "// uniforms\nuniform mat4 uni_model_view_projection; // not referenced in GS\nuniform vec4 uni_colors_white;          // referenced in GS\n\n// uniforms blocks\nuniform Matrices\n{\n    mat4 model;\n    mat4 view;\n    mat4 projection;\n} uni_matrices; // not referenced at all\n\nuniform Colors\n{\n    vec4 red;\n    vec4 green;\n    vec4 blue;\n} uni_colors; // referenced in GS\n\n"
  ;
  local_d8 = 
  "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout (points)                           in;\nlayout (triangle_strip, max_vertices = 6) out;\n\n// uniforms included here\n"
  ;
  GVar3 = (**(code **)(_maxGSAtomicCounters + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar3;
  GVar3 = (**(code **)(_maxGSAtomicCounters + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id = GVar3;
  GVar3 = (**(code **)(_maxGSAtomicCounters + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar3;
  GVar3 = (**(code **)(_maxGSAtomicCounters + 0x3c8))();
  this->m_program_object_id = GVar3;
  err = (**(code **)(_maxGSAtomicCounters + 0x800))();
  glu::checkError(err,"Could not create program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderProgramResource.cpp"
                  ,0x138);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_object_id,this->m_fragment_shader_id,
                     1,&m_fragment_shader_code,this->m_geometry_shader_id,
                     vertex_shader_code_parts[7]._4_4_,&local_d8,this->m_vertex_shader_id,
                     vertex_shader_code_parts[7]._4_4_,geometry_shader_code_parts + 7,(bool *)0x0);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Could not create program from valid vertex/geometry/fragment shader",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderProgramResource.cpp"
               ,0x141);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void GeometryShaderProgramResourceTest::initTest()
{
	/* Check if geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint maxVSAtomicCounters = 0;
	gl.getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &maxVSAtomicCounters);

	glw::GLint maxGSAtomicCounters = 0;
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &maxGSAtomicCounters);

	m_atomic_counters_supported = maxVSAtomicCounters >= 2 && maxGSAtomicCounters >= 1;

	glw::GLint maxVSStorageBlocks = 0;
	gl.getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &maxVSStorageBlocks);

	glw::GLint maxGSStorageBlocks = 0;
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &maxGSStorageBlocks);

	m_ssbos_supported = maxVSStorageBlocks >= 2 && maxGSStorageBlocks >= 1;

	glw::GLuint nCodeParts = 0;
	const char* vertex_shader_code_parts[8];
	const char* geometry_shader_code_parts[8];

	/* Vertex & geometry shaders */
	if (m_atomic_counters_supported && m_ssbos_supported)
	{
		vertex_shader_code_parts[0] = m_vertex_shader_code_preamble;
		vertex_shader_code_parts[1] = m_common_shader_code_definitions_body;
		vertex_shader_code_parts[2] = m_common_shader_code_definitions_atomic_counter_body;
		vertex_shader_code_parts[3] = m_common_shader_code_definitions_ssbo_body;
		vertex_shader_code_parts[4] = m_vertex_shader_code_body;
		vertex_shader_code_parts[5] = m_vertex_shader_code_atomic_counter_body;
		vertex_shader_code_parts[6] = m_vertex_shader_code_ssbo_body;
		vertex_shader_code_parts[7] = "}\n";

		geometry_shader_code_parts[0] = m_geometry_shader_code_preamble;
		geometry_shader_code_parts[1] = m_common_shader_code_definitions_body;
		geometry_shader_code_parts[2] = m_common_shader_code_definitions_atomic_counter_body;
		geometry_shader_code_parts[3] = m_common_shader_code_definitions_ssbo_body;
		geometry_shader_code_parts[4] = m_geometry_shader_code_body;
		geometry_shader_code_parts[5] = m_geometry_shader_code_atomic_counter_body;
		geometry_shader_code_parts[6] = m_geometry_shader_code_ssbo_body;
		geometry_shader_code_parts[7] = "}\n";

		nCodeParts = 8;
	}
	else if (m_atomic_counters_supported)
	{
		vertex_shader_code_parts[0] = m_vertex_shader_code_preamble;
		vertex_shader_code_parts[1] = m_common_shader_code_definitions_body;
		vertex_shader_code_parts[2] = m_common_shader_code_definitions_atomic_counter_body;
		vertex_shader_code_parts[3] = m_vertex_shader_code_body;
		vertex_shader_code_parts[4] = m_vertex_shader_code_atomic_counter_body;
		vertex_shader_code_parts[5] = "}\n";

		geometry_shader_code_parts[0] = m_geometry_shader_code_preamble;
		geometry_shader_code_parts[1] = m_common_shader_code_definitions_body;
		geometry_shader_code_parts[2] = m_common_shader_code_definitions_atomic_counter_body;
		geometry_shader_code_parts[3] = m_geometry_shader_code_body;
		geometry_shader_code_parts[4] = m_geometry_shader_code_atomic_counter_body;
		geometry_shader_code_parts[5] = "}\n";

		nCodeParts = 6;
	}
	else if (m_ssbos_supported)
	{
		vertex_shader_code_parts[0] = m_vertex_shader_code_preamble;
		vertex_shader_code_parts[1] = m_common_shader_code_definitions_body;
		vertex_shader_code_parts[2] = m_common_shader_code_definitions_ssbo_body;
		vertex_shader_code_parts[3] = m_vertex_shader_code_body;
		vertex_shader_code_parts[4] = m_vertex_shader_code_ssbo_body;
		vertex_shader_code_parts[5] = "}\n";

		geometry_shader_code_parts[0] = m_geometry_shader_code_preamble;
		geometry_shader_code_parts[1] = m_common_shader_code_definitions_body;
		geometry_shader_code_parts[2] = m_common_shader_code_definitions_ssbo_body;
		geometry_shader_code_parts[3] = m_geometry_shader_code_body;
		geometry_shader_code_parts[4] = m_geometry_shader_code_ssbo_body;
		geometry_shader_code_parts[5] = "}\n";

		nCodeParts = 6;
	}
	else
	{
		vertex_shader_code_parts[0] = m_vertex_shader_code_preamble;
		vertex_shader_code_parts[1] = m_common_shader_code_definitions_body;
		vertex_shader_code_parts[2] = m_vertex_shader_code_body;
		vertex_shader_code_parts[3] = "}\n";

		geometry_shader_code_parts[0] = m_geometry_shader_code_preamble;
		geometry_shader_code_parts[1] = m_common_shader_code_definitions_body;
		geometry_shader_code_parts[2] = m_geometry_shader_code_body;
		geometry_shader_code_parts[3] = "}\n";

		nCodeParts = 4;
	}

	/* Create shader objects */
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);

	/* Create program object */
	m_program_object_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create program object");

	/* Build program object */
	if (true !=
		buildProgram(m_program_object_id, m_fragment_shader_id, 1,				 /* Fragment shader parts number */
					 &m_fragment_shader_code, m_geometry_shader_id, nCodeParts,  /* Geometry shader parts number */
					 geometry_shader_code_parts, m_vertex_shader_id, nCodeParts, /* Vertex shader parts number */
					 vertex_shader_code_parts))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}
}